

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  Stoppable stoppable;
  AReceiver a;
  DemoController demo;
  BaseStoppable local_1a8;
  BaseComponent local_170;
  BaseComponent local_c0;
  undefined2 local_10;
  
  BaseComponent::BaseComponent(&local_c0);
  local_c0.super_BaseStoppable.super_BaseThread._vptr_BaseThread = (_func_int **)&PTR_Run_00108a70;
  local_10 = 0;
  BaseThread::Start((BaseThread *)&local_c0,0);
  BaseComponent::BaseComponent(&local_170);
  local_170.super_BaseStoppable.super_BaseThread._vptr_BaseThread = (_func_int **)&PTR_Run_00108ac0;
  BaseThread::Start((BaseThread *)&local_170,0);
  local_1a8.super_BaseThread._vptr_BaseThread = (_func_int **)0x0;
  local_1a8.super_BaseThread.thread._M_id._M_thread = (id)50000000;
  do {
    iVar1 = nanosleep((timespec *)&local_1a8,(timespec *)&local_1a8);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  BaseStoppable::BaseStoppable(&local_1a8);
  local_1a8.super_BaseThread._vptr_BaseThread = (_func_int **)&PTR_Run_00108b10;
  BaseThread::operator()(&local_1a8.super_BaseThread,0);
  BaseStoppable::Stop(&local_1a8);
  BaseThread::Wait(&local_1a8.super_BaseThread);
  BaseThread::Wait((BaseThread *)&local_c0);
  BaseStoppable::Stop(&local_170.super_BaseStoppable);
  BaseThread::Wait((BaseThread *)&local_170);
  local_1a8.super_BaseThread._vptr_BaseThread = (_func_int **)&PTR___cxa_pure_virtual_00108ba0;
  if (local_1a8.object.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.object.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<void>::~promise(&local_1a8.signal);
  local_1a8.super_BaseThread._vptr_BaseThread = (_func_int **)&PTR___cxa_pure_virtual_00108bb8;
  if (local_1a8.super_BaseThread.thread._M_id._M_thread == 0) {
    BaseComponent::~BaseComponent(&local_170);
    BaseComponent::~BaseComponent(&local_c0);
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc, char **argv) {
    (void)argc, (void)argv;

    DemoController demo;
    demo.Start();

    AReceiver a;
    a.Start();

    std::this_thread::sleep_for(std::chrono::milliseconds(50));

    Stoppable stoppable;
    stoppable();
    stoppable.Stop();

    stoppable.Wait();
    demo.Wait();

    a.Stop();
    a.Wait();
    return 0;
}